

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.c
# Opt level: O2

void Rule_delete(Rule *rule)

{
  Scenario *scenario;
  wchar_t wVar1;
  ChildDefinitions *__ptr;
  long lVar2;
  
  if (rule != (Rule *)0x0) {
    free(rule->id);
    free(rule->keyword);
    free(rule->name);
    free(rule->description);
    if (rule->tags != (Tags *)0x0) {
      Tags_delete(rule->tags);
    }
    __ptr = rule->child_definitions;
    if (__ptr != (ChildDefinitions *)0x0) {
      wVar1 = __ptr->child_definition_count;
      if (L'\0' < wVar1) {
        for (lVar2 = 0; lVar2 < wVar1; lVar2 = lVar2 + 1) {
          scenario = (Scenario *)__ptr->child_definitions[lVar2];
          if (scenario->type == Gherkin_Scenario) {
            Scenario_delete(scenario);
          }
          else if (scenario->type == Gherkin_Background) {
            Background_delete((Background *)scenario);
          }
          __ptr = rule->child_definitions;
          wVar1 = __ptr->child_definition_count;
        }
        free(__ptr->child_definitions);
        __ptr = rule->child_definitions;
      }
      free(__ptr);
    }
    free(rule);
    return;
  }
  return;
}

Assistant:

void Rule_delete(const Rule* rule) {
    if (!rule) {
        return;
    }
    if (rule->id) {
        free((void*)rule->id);
    }
    if (rule->keyword) {
        free((void*)rule->keyword);
    }
    if (rule->name) {
        free((void*)rule->name);
    }
    if (rule->description) {
        free((void*)rule->description);
    }
    if (rule->tags) {
        Tags_delete(rule->tags);
    }
    if (rule->child_definitions) {
        ChildDefinition* scenario_definition;
        if (rule->child_definitions->child_definition_count > 0) {
            int i;
            for(i = 0; i < rule->child_definitions->child_definition_count; ++i) {
                scenario_definition = rule->child_definitions->child_definitions[i];
                if (scenario_definition->type == Gherkin_Background) {
                    Background_delete((Background*)scenario_definition);
                }
                else if (scenario_definition->type == Gherkin_Scenario) {
                    Scenario_delete((Scenario*)scenario_definition);
                }
            }
            free((void*)rule->child_definitions->child_definitions);
        }
        free((void*)rule->child_definitions);
    }
    free((void*)rule);
}